

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random-solver.cpp
# Opt level: O3

bool __thiscall
baryonyx::itm::
solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>>
::
compute_update_row<baryonyx::bit_array,std::reverse_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>
          (solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>>
           *this,bit_array *x,
          reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
          *first,reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                 *last,double kappa,double delta,double theta)

{
  double *pdVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  _Head_base<0UL,_double_*,_false> _Var6;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *__g;
  double *pdVar7;
  int iVar8;
  undefined8 uVar9;
  uint uVar10;
  bool bVar11;
  uint uVar12;
  int *piVar13;
  _Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor_*,_false>
  _Var14;
  _Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data_*,_false>
  _Var15;
  rc_data *prVar16;
  undefined8 extraout_RAX;
  int iVar17;
  _Head_base<0UL,_int_*,_false> _Var18;
  int iVar19;
  __uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true> _Var20;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false> _Var21;
  row_value *prVar22;
  long lVar23;
  type it;
  long lVar24;
  long lVar25;
  int iVar26;
  long lVar27;
  bool bVar28;
  double dVar29;
  double dVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [64];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined8 in_XMM4_Qb;
  double local_b8;
  undefined1 local_98 [16];
  _Head_base<0UL,_int_*,_false> local_88;
  solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>
  *local_80;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false> local_78;
  solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>>
  *local_70;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false> local_68;
  double local_60;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  *local_58;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  *local_50;
  long local_48;
  unique_ptr<int[],_std::default_delete<int[]>_> local_40;
  _Head_base<0UL,_int_*,_false> local_38;
  
  piVar13 = (first->current)._M_current;
  if (piVar13 != (last->current)._M_current) {
    local_70 = this + 8;
    dVar29 = kappa / (1.0 - kappa);
    local_80 = (solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>
                *)this;
    local_60 = theta;
    local_58 = first;
    local_50 = last;
    do {
      _Var20.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
      super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>
      ._M_head_impl = (__uniq_ptr_impl<int,_std::default_delete<int[]>_>)(long)piVar13[-1];
      if (((solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>
            *)this)->m <= piVar13[-1]) {
        compute_update_row<baryonyx::bit_array,std::reverse_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>
                  ();
        goto LAB_0019dc9e;
      }
      sparse_matrix<int>::row((sparse_matrix<int> *)local_98,(int)local_70);
      _Var21._M_head_impl = (row_value *)0x0;
      local_88._M_head_impl =
           (int *)_Var20.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                  super__Head_base<0UL,_int_*,_false>._M_head_impl;
      if (local_98._8_8_ != local_98._0_8_) {
        _Var6._M_head_impl =
             (((solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>
                *)this)->P)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
             super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
             super__Head_base<0UL,_double_*,_false>._M_head_impl;
        _Var18._M_head_impl = (int *)local_98._8_8_;
        do {
          iVar26 = *_Var18._M_head_impl;
          _Var18._M_head_impl = _Var18._M_head_impl + 8;
          _Var6._M_head_impl[iVar26] = local_60 * _Var6._M_head_impl[iVar26];
        } while (_Var18._M_head_impl != (int *)local_98._0_8_);
        _Var21._M_head_impl = (row_value *)0x0;
        if (local_98._8_8_ != local_98._0_8_) {
          _Var21._M_head_impl = (row_value *)0x0;
          piVar13 = (int *)local_98._8_8_;
          uVar10 = 1;
          do {
            uVar12 = uVar10;
            prVar22 = _Var21._M_head_impl;
            sparse_matrix<int>::column((sparse_matrix<int> *)&local_40,(int)local_70);
            _Var18._M_head_impl =
                 (((solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>
                    *)this)->A)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                 super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl;
            if ((__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)local_38._M_head_impl
                == (__uniq_ptr_impl<int,_std::default_delete<int[]>_>)
                   local_40._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                   super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                   super__Head_base<0UL,_int_*,_false>._M_head_impl) {
              local_b8 = 0.0;
            }
            else {
              auVar39 = ZEXT864(0) << 0x40;
              do {
                iVar26 = *local_38._M_head_impl;
                local_38._M_head_impl = local_38._M_head_impl + 2;
                auVar31._0_8_ = (double)_Var18._M_head_impl[iVar26];
                auVar31._8_8_ = in_XMM4_Qb;
                auVar2._8_8_ = 0;
                auVar2._0_8_ = (((solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>
                                  *)this)->P)._M_t.
                               super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                               super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                               super__Head_base<0UL,_double_*,_false>._M_head_impl[iVar26];
                auVar2 = vfmadd231sd_fma(auVar39._0_16_,auVar31,auVar2);
                auVar39 = ZEXT1664(auVar2);
              } while ((__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)
                       local_38._M_head_impl !=
                       (__uniq_ptr_impl<int,_std::default_delete<int[]>_>)
                       local_40._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                       super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                       super__Head_base<0UL,_int_*,_false>._M_head_impl);
              local_b8 = auVar2._0_8_;
            }
            _Var15._M_head_impl =
                 (((solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>
                    *)this)->R)._M_t.
                 super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[]>_>
                 .
                 super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data_*,_false>
                 ._M_head_impl;
            *(int *)((long)(_Var15._M_head_impl + (long)prVar22) + 8) = (int)prVar22;
            *(int *)((long)(_Var15._M_head_impl + (long)prVar22) + 0xc) =
                 _Var18._M_head_impl[*piVar13];
            dVar30 = quadratic_cost_type<double>::operator()
                               (((solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>
                                  *)this)->c,*(int *)(local_98._8_8_ + 4),x);
            _Var15._M_head_impl =
                 (((solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>
                    *)this)->R)._M_t.
                 super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[]>_>
                 .
                 super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data_*,_false>
                 ._M_head_impl;
            piVar13 = piVar13 + 2;
            _Var15._M_head_impl[(long)prVar22].value = dVar30 - local_b8;
            _Var21._M_head_impl = (row_value *)((long)&prVar22->value + 1);
            uVar10 = uVar12 + 1;
          } while (piVar13 != (int *)local_98._0_8_);
          if (prVar22 != (row_value *)0x0) {
            __g = ((solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>
                    *)this)->rng;
            std::
            __introsort_loop<baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>>::rc_data*>(baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>>::rc_data*,baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                      (_Var15._M_head_impl,
                       _Var15._M_head_impl + ((ulong)_Var21._M_head_impl & 0xffffffff),
                       (int)LZCOUNT((ulong)_Var21._M_head_impl & 0xffffffff) * 2 ^ 0x7e);
            std::
            __final_insertion_sort<baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>>::rc_data*>(baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>>::rc_data*,baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                      (_Var15._M_head_impl,
                       _Var15._M_head_impl + ((ulong)_Var21._M_head_impl & 0xffffffff));
            prVar16 = _Var15._M_head_impl + 1;
            lVar27 = (ulong)uVar12 * 0x10 + -0x10;
            do {
              if (((_Var15._M_head_impl)->value != prVar16->value) ||
                 (NAN((_Var15._M_head_impl)->value) || NAN(prVar16->value))) {
                std::
                shuffle<baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                          (_Var15._M_head_impl,prVar16,__g);
                _Var15._M_head_impl = prVar16;
              }
              prVar16 = prVar16 + 1;
              lVar27 = lVar27 + -0x10;
            } while (lVar27 != 0);
            std::
            shuffle<baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                      (_Var15._M_head_impl,prVar16,__g);
          }
        }
      }
      iVar26 = 0;
      _Var14._M_head_impl =
           (((solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>
              *)this)->b)._M_t.
           super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor[]>_>
           .
           super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor_*,_false>
           ._M_head_impl;
      local_68._M_head_impl = (col_value *)((long)local_88._M_head_impl * 3);
      if (_Var14._M_head_impl[(long)local_88._M_head_impl].min < 1) {
        lVar27 = 0xffffffff;
LAB_0019da8c:
        iVar8 = (int)lVar27;
        iVar17 = iVar8 + 1;
        iVar19 = (int)_Var21._M_head_impl;
        if ((iVar17 < iVar19) &&
           (iVar26 <= (&(_Var14._M_head_impl)->max)[(long)local_68._M_head_impl])) {
          _Var15._M_head_impl =
               (((solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>
                  *)this)->R)._M_t.
               super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[]>_>
               .
               super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data_*,_false>
               ._M_head_impl;
          lVar23 = (long)iVar8 << 4;
          lVar25 = (long)iVar8 + 1;
          do {
            lVar27 = lVar25;
            iVar26 = iVar26 + *(int *)((long)&_Var15._M_head_impl[1].a + lVar23);
            _Var14._M_head_impl =
                 (((solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>
                    *)this)->b)._M_t.
                 super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor[]>_>
                 .
                 super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor_*,_false>
                 ._M_head_impl;
            if (iVar26 < *(int *)((long)&(_Var14._M_head_impl)->min +
                                 (long)local_68._M_head_impl * 4)) {
              piVar13 = (int *)(local_98._8_8_ +
                               (long)*(int *)((long)&_Var15._M_head_impl[1].id + lVar23) * 2 * 4);
LAB_0019db89:
              bit_array_impl::unset(&x->super_bit_array_impl,piVar13[1]);
              _Var6._M_head_impl =
                   (((solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>
                      *)this)->P)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>
                   ._M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                   super__Head_base<0UL,_double_*,_false>._M_head_impl;
              auVar38._8_8_ = 0;
              auVar38._0_8_ = dVar29;
              auVar5._8_8_ = 0;
              auVar5._0_8_ = delta;
              auVar34._8_8_ = 0;
              auVar34._0_8_ =
                   *(double *)
                    ((long)((((solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>
                               *)this)->R)._M_t.
                            super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[]>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[]>_>
                            .
                            super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data_*,_false>
                            ._M_head_impl + 1) + lVar23) * 0.5;
              auVar2 = vfmadd213sd_fma(auVar34,auVar38,auVar5);
              _Var6._M_head_impl[*piVar13] = _Var6._M_head_impl[*piVar13] - auVar2._0_8_;
              break;
            }
            piVar13 = (int *)(local_98._8_8_ +
                             (long)*(int *)((long)&_Var15._M_head_impl[1].id + lVar23) * 2 * 4);
            if (*(int *)((long)&(_Var14._M_head_impl)->max + (long)local_68._M_head_impl * 4) <
                iVar26) goto LAB_0019db89;
            dVar30 = *(double *)((long)&_Var15._M_head_impl[1].value + lVar23);
            bVar11 = dVar30 == 0.0;
            bVar28 = dVar30 < 0.0;
            if ((bVar11) && (!NAN(dVar30))) {
              dVar30 = std::
                       generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                                 (((solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>
                                    *)this)->rng);
              bVar11 = dVar30 == 0.5;
              bVar28 = 0.5 < dVar30;
            }
            if (bVar28 || bVar11) goto LAB_0019db89;
            bit_array_impl::set(&x->super_bit_array_impl,piVar13[1]);
            _Var15._M_head_impl =
                 (((solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>
                    *)this)->R)._M_t.
                 super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[]>_>
                 .
                 super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data_*,_false>
                 ._M_head_impl;
            _Var6._M_head_impl =
                 (((solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>
                    *)this)->P)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                 _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                 super__Head_base<0UL,_double_*,_false>._M_head_impl;
            auVar37._8_8_ = 0;
            auVar37._0_8_ = dVar29;
            pdVar1 = (double *)((long)&_Var15._M_head_impl[1].value + lVar23);
            lVar23 = lVar23 + 0x10;
            auVar4._8_8_ = 0;
            auVar4._0_8_ = delta;
            auVar33._8_8_ = 0;
            auVar33._0_8_ = *pdVar1 * 0.5;
            auVar2 = vfmadd213sd_fma(auVar33,auVar37,auVar4);
            _Var6._M_head_impl[*piVar13] = auVar2._0_8_ + _Var6._M_head_impl[*piVar13];
            lVar25 = lVar27 + 1;
          } while (lVar27 + 1 < (long)iVar19);
          iVar17 = (int)lVar27 + 1;
        }
      }
      else {
        _Var15._M_head_impl =
             (((solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>
                *)this)->R)._M_t.
             super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[]>_>
             .
             super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data_*,_false>
             ._M_head_impl;
        lVar23 = 0;
        iVar26 = 0;
        local_48 = (long)(int)_Var21._M_head_impl + -2;
        lVar25 = -1;
        local_78._M_head_impl = _Var21._M_head_impl;
        do {
          uVar9 = local_98._8_8_;
          lVar24 = (long)*(int *)((long)&(_Var15._M_head_impl)->id + lVar23);
          iVar26 = iVar26 + *(int *)((long)&(_Var15._M_head_impl)->a + lVar23);
          lVar27 = lVar25 + 1;
          iVar19 = *(int *)((long)&((((solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>
                                       *)this)->b)._M_t.
                                    super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor[]>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor[]>_>
                                    .
                                    super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor_*,_false>
                                   ._M_head_impl)->min + (long)local_68._M_head_impl * 4);
          bit_array_impl::set(&x->super_bit_array_impl,
                              *(int *)(local_98._8_8_ + (lVar24 * 2 + 1) * 4));
          auVar36._8_8_ = 0;
          auVar36._0_8_ = dVar29;
          _Var15._M_head_impl =
               (local_80->R)._M_t.
               super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[]>_>
               .
               super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data_*,_false>
               ._M_head_impl;
          _Var6._M_head_impl =
               (local_80->P)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t
               .super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
               super__Head_base<0UL,_double_*,_false>._M_head_impl;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = delta;
          auVar32._8_8_ = 0;
          auVar32._0_8_ = *(double *)((long)&(_Var15._M_head_impl)->value + lVar23) * 0.5;
          auVar2 = vfmadd213sd_fma(auVar32,auVar36,auVar3);
          _Var6._M_head_impl[*(int *)(uVar9 + lVar24 * 2 * 4)] =
               auVar2._0_8_ + _Var6._M_head_impl[*(int *)(uVar9 + lVar24 * 2 * 4)];
          this = (solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>>
                  *)local_80;
          if (iVar19 <= iVar26) break;
          lVar23 = lVar23 + 0x10;
          bVar11 = lVar25 < local_48;
          lVar25 = lVar27;
        } while (bVar11);
        _Var14._M_head_impl =
             (local_80->b)._M_t.
             super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor[]>_>
             .
             super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor_*,_false>
             ._M_head_impl;
        _Var21._M_head_impl = local_78._M_head_impl;
        if (*(int *)((long)&(_Var14._M_head_impl)->min + (long)local_68._M_head_impl * 4) <= iVar26)
        goto LAB_0019da8c;
        iVar19 = (int)local_78._M_head_impl;
        iVar17 = (int)lVar27 + 1;
      }
      this = (solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>>
              *)local_80;
      if (iVar17 < iVar19) {
        prVar16 = (local_80->R)._M_t.
                  super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[]>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[]>_>
                  .
                  super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data_*,_false>
                  ._M_head_impl;
        lVar25 = (long)(int)(uint)lVar27 << 4;
        iVar19 = ~(uint)lVar27 + iVar19;
        do {
          uVar9 = local_98._8_8_;
          lVar27 = (long)*(int *)((long)&prVar16[1].id + lVar25);
          bit_array_impl::unset
                    (&x->super_bit_array_impl,*(int *)(local_98._8_8_ + (lVar27 * 2 + 1) * 4));
          prVar16 = (((solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>
                       *)this)->R)._M_t.
                    super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[]>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data[]>_>
                    .
                    super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::rc_data_*,_false>
                    ._M_head_impl;
          pdVar7 = (((solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>
                      *)this)->P)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>
                   ._M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                   super__Head_base<0UL,_double_*,_false>._M_head_impl;
          auVar41._8_8_ = 0;
          auVar41._0_8_ = dVar29;
          auVar40._8_8_ = 0;
          auVar40._0_8_ = delta;
          pdVar1 = (double *)((long)&prVar16[1].value + lVar25);
          lVar25 = lVar25 + 0x10;
          iVar19 = iVar19 + -1;
          auVar35._8_8_ = 0;
          auVar35._0_8_ = *pdVar1 * 0.5;
          auVar2 = vfmadd213sd_fma(auVar35,auVar41,auVar40);
          pdVar7[*(int *)(uVar9 + lVar27 * 2 * 4)] =
               pdVar7[*(int *)(uVar9 + lVar27 * 2 * 4)] - auVar2._0_8_;
        } while (iVar19 != 0);
      }
      bVar11 = is_valid_constraint<baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>>,baryonyx::bit_array>
                         ((solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>
                           *)this,(int)local_88._M_head_impl,x);
      if (!bVar11) {
LAB_0019dc9e:
        compute_update_row<baryonyx::bit_array,std::reverse_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>
                  ();
        __clang_call_terminate(extraout_RAX);
      }
      piVar13 = (local_58->current)._M_current + -1;
      (local_58->current)._M_current = piVar13;
    } while (piVar13 != (local_50->current)._M_current);
  }
  return false;
}

Assistant:

bool compute_update_row(Xtype& x,
                            Iterator first,
                            Iterator last,
                            Float kappa,
                            Float delta,
                            Float theta)
    {
        for (; first != last; ++first) {
            auto k = constraint(first);
            bx_expects(k < m);

            auto [row_begin, row_end] = ap.row(k);
            decrease_preference(row_begin, row_end, theta);

            int r_size = 0;
            for (auto it = row_begin; it != row_end; ++it, ++r_size) {
                Float sum_a_p = 0;

                auto [col_begin, col_end] = ap.column(it->column);
                for (; col_begin != col_end; ++col_begin)
                    sum_a_p += static_cast<Float>(A[col_begin->value]) *
                               P[col_begin->value];

                R[r_size].id = r_size;
                R[r_size].a = A[it->value];
                R[r_size].value = c(row_begin->column, x) - sum_a_p;
            }

            calculator_sort<Mode>(R.get(), R.get() + r_size, rng);

            int value = 0;
            bool valid = b[k].min <= 0;
            int i = -1;

            // if (!valid) {
            //     do {
            //         ++i;
            //         value += R[i].a;
            //         valid = b[k].min <= value;
            //     } while (!valid && i + 1 < r_size);
            // }

            // valid = b[k].min <= value && value <= b[k].max;
            // while (i + 1 < r_size && valid) {
            //     ++i;
            //     value += R[i].a;
            //     valid = b[k].min <= value && value <= b[k].max;
            // }

            // std::uniform_real_distribution<Float> real_dist(Float{ 0 },
            //                                                 Float{ 1 });

            // auto selected = i;
            // auto d = delta;

            // if (selected < 0) {
            //     d += (kappa / (one - kappa)) * (R[0].value / two);
            //     d *= real_dist(rng);

            //     for (i = 0; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         } else {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         }
            //     }
            // } else if (selected + 1 >= r_size) {
            //     d += (kappa / (one - kappa)) * (R[selected].value * middle);
            //     d *= real_dist(rng);

            //     for (i = 0; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         } else {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         }
            //     }
            // } else {
            //     d += (kappa / (one - kappa)) *
            //          (R[selected + 1].value - R[selected].value);
            //     d *= real_dist(rng);

            //     for (i = 0; i <= selected; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         } else {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         }
            //     }

            //     for (; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         } else {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         }
            //     }

            constexpr Float one{ 1 };
            constexpr Float two{ 2 };

            if (!valid) {
                do {
                    ++i;
                    value += R[i].a;
                    valid = b[k].min <= value;
                    auto var = row_begin + R[i].id;
                    x.set(var->column);
                    P[var->value] +=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                } while (!valid && i + 1 < r_size);
            }

            valid = b[k].min <= value && value <= b[k].max;
            while (i + 1 < r_size && valid) {
                ++i;
                value += R[i].a;
                valid = b[k].min <= value && value <= b[k].max;
                auto var = row_begin + R[i].id;

                if (valid)
                    valid = stop_iterating<Mode>(R[i].value, rng);

                if (valid) {
                    x.set(var->column);
                    P[var->value] +=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                } else {
                    x.unset(var->column);
                    P[var->value] -=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                }
            }

            while (i + 1 < r_size) {
                ++i;
                auto var = row_begin + R[i].id;
                x.unset(var->column);
                P[var->value] -=
                  delta + (kappa / (one - kappa)) * (R[i].value / two);
            }

            bx_expects(is_valid_constraint(*this, k, x));
        }

        return false;
    }